

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O3

void Str_MuxChangeOnce(Str_Mux_t *pTree,int *pPath,int i,int k,Str_Mux_t *pBackup,Gia_Man_t *pNew,
                      Vec_Int_t *vDelay)

{
  uint *puVar1;
  Str_Edg_t *pSVar2;
  uint uVar3;
  uint uVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  Str_Mux_t *pSVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  uint local_5c;
  
  iVar19 = i + 1;
  if (k <= iVar19) {
    __assert_fail("i + 1 < k",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                  ,0x609,
                  "void Str_MuxChangeOnce(Str_Mux_t *, int *, int, int, Str_Mux_t *, Gia_Man_t *, Vec_Int_t *)"
                 );
  }
  lVar29 = (long)k;
  lVar30 = (long)i;
  if (pBackup != (Str_Mux_t *)0x0) {
    if (pPath[lVar29] < 0) goto LAB_0072ce35;
    uVar26 = (uint)pPath[lVar29] >> 1;
    pSVar25 = pTree + uVar26;
    iVar15 = pSVar25->Id;
    iVar16 = pSVar25->Delay;
    iVar17 = pSVar25->Copy;
    iVar18 = pSVar25->nLutSize;
    pSVar2 = pTree[uVar26].Edge;
    iVar11 = pSVar2->Fan;
    iVar12 = pSVar2->fCompl;
    iVar13 = pSVar2->FanDel;
    iVar14 = pSVar2->Copy;
    pSVar2 = pTree[uVar26].Edge + 1;
    iVar7 = pSVar2->Fan;
    iVar8 = pSVar2->fCompl;
    iVar9 = pSVar2->FanDel;
    iVar10 = pSVar2->Copy;
    pSVar2 = pTree[uVar26].Edge + 2;
    iVar23 = pSVar2->fCompl;
    iVar28 = pSVar2->FanDel;
    iVar6 = pSVar2->Copy;
    pBackup->Edge[2].Fan = pSVar2->Fan;
    pBackup->Edge[2].fCompl = iVar23;
    pBackup->Edge[2].FanDel = iVar28;
    pBackup->Edge[2].Copy = iVar6;
    pBackup->Edge[1].Fan = iVar7;
    pBackup->Edge[1].fCompl = iVar8;
    pBackup->Edge[1].FanDel = iVar9;
    pBackup->Edge[1].Copy = iVar10;
    pBackup->Edge[0].Fan = iVar11;
    pBackup->Edge[0].fCompl = iVar12;
    pBackup->Edge[0].FanDel = iVar13;
    pBackup->Edge[0].Copy = iVar14;
    pBackup->Id = iVar15;
    pBackup->Delay = iVar16;
    pBackup->Copy = iVar17;
    pBackup->nLutSize = iVar18;
    if (pPath[iVar19] < 0) goto LAB_0072ce35;
    uVar26 = (uint)pPath[iVar19] >> 1;
    pSVar25 = pTree + uVar26;
    iVar15 = pSVar25->Id;
    iVar16 = pSVar25->Delay;
    iVar17 = pSVar25->Copy;
    iVar18 = pSVar25->nLutSize;
    pSVar2 = pTree[uVar26].Edge;
    iVar11 = pSVar2->Fan;
    iVar12 = pSVar2->fCompl;
    iVar13 = pSVar2->FanDel;
    iVar14 = pSVar2->Copy;
    pSVar2 = pTree[uVar26].Edge + 1;
    iVar7 = pSVar2->Fan;
    iVar8 = pSVar2->fCompl;
    iVar9 = pSVar2->FanDel;
    iVar10 = pSVar2->Copy;
    pSVar2 = pTree[uVar26].Edge + 2;
    iVar23 = pSVar2->fCompl;
    iVar28 = pSVar2->FanDel;
    iVar6 = pSVar2->Copy;
    pBackup[1].Edge[2].Fan = pSVar2->Fan;
    pBackup[1].Edge[2].fCompl = iVar23;
    pBackup[1].Edge[2].FanDel = iVar28;
    pBackup[1].Edge[2].Copy = iVar6;
    pBackup[1].Edge[1].Fan = iVar7;
    pBackup[1].Edge[1].fCompl = iVar8;
    pBackup[1].Edge[1].FanDel = iVar9;
    pBackup[1].Edge[1].Copy = iVar10;
    pBackup[1].Edge[0].Fan = iVar11;
    pBackup[1].Edge[0].fCompl = iVar12;
    pBackup[1].Edge[0].FanDel = iVar13;
    pBackup[1].Edge[0].Copy = iVar14;
    pBackup[1].Id = iVar15;
    pBackup[1].Delay = iVar16;
    pBackup[1].Copy = iVar17;
    pBackup[1].nLutSize = iVar18;
    if (pPath[lVar30] < 0) goto LAB_0072ce35;
    uVar26 = (uint)pPath[lVar30] >> 1;
    pSVar25 = pTree + uVar26;
    iVar15 = pSVar25->Id;
    iVar16 = pSVar25->Delay;
    iVar17 = pSVar25->Copy;
    iVar18 = pSVar25->nLutSize;
    pSVar2 = pTree[uVar26].Edge;
    iVar11 = pSVar2->Fan;
    iVar12 = pSVar2->fCompl;
    iVar13 = pSVar2->FanDel;
    iVar14 = pSVar2->Copy;
    pSVar2 = pTree[uVar26].Edge + 1;
    iVar7 = pSVar2->Fan;
    iVar8 = pSVar2->fCompl;
    iVar9 = pSVar2->FanDel;
    iVar10 = pSVar2->Copy;
    pSVar2 = pTree[uVar26].Edge + 2;
    iVar23 = pSVar2->fCompl;
    iVar28 = pSVar2->FanDel;
    iVar6 = pSVar2->Copy;
    pBackup[2].Edge[2].Fan = pSVar2->Fan;
    pBackup[2].Edge[2].fCompl = iVar23;
    pBackup[2].Edge[2].FanDel = iVar28;
    pBackup[2].Edge[2].Copy = iVar6;
    pBackup[2].Edge[1].Fan = iVar7;
    pBackup[2].Edge[1].fCompl = iVar8;
    pBackup[2].Edge[1].FanDel = iVar9;
    pBackup[2].Edge[1].Copy = iVar10;
    pBackup[2].Edge[0].Fan = iVar11;
    pBackup[2].Edge[0].fCompl = iVar12;
    pBackup[2].Edge[0].FanDel = iVar13;
    pBackup[2].Edge[0].Copy = iVar14;
    pBackup[2].Id = iVar15;
    pBackup[2].Delay = iVar16;
    pBackup[2].Copy = iVar17;
    pBackup[2].nLutSize = iVar18;
  }
  uVar26 = pPath[lVar29];
  if (((-1 < (int)uVar26) && (uVar3 = pPath[iVar19], -1 < (int)uVar3)) &&
     (uVar4 = pPath[lVar30], -1 < (int)uVar4)) {
    uVar24 = (ulong)((uVar26 & 1) << 4);
    iVar19 = *(int *)((long)&pTree[uVar26 >> 1].Edge[0].Fan + uVar24);
    if (iVar19 < 1) {
      __assert_fail("pSpots[0]->Edge[pInds[0]].Fan > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                    ,0x618,
                    "void Str_MuxChangeOnce(Str_Mux_t *, int *, int, int, Str_Mux_t *, Gia_Man_t *, Vec_Int_t *)"
                   );
    }
    uVar27 = uVar3 >> 1;
    uVar20 = (ulong)((uVar3 & 1) << 4);
    if (*(int *)((long)&pTree[uVar27].Edge[0].Fan + uVar20) < 1) {
      __assert_fail("pSpots[1]->Edge[pInds[1]].Fan > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                    ,0x619,
                    "void Str_MuxChangeOnce(Str_Mux_t *, int *, int, int, Str_Mux_t *, Gia_Man_t *, Vec_Int_t *)"
                   );
    }
    pSVar25 = pTree + (uVar4 >> 1);
    local_5c = 0;
    lVar21 = 1;
    do {
      uVar3 = pPath[lVar30 + lVar21];
      if ((int)uVar3 < 0) goto LAB_0072ce35;
      local_5c = local_5c ^
                 *(uint *)((long)&pTree[uVar3 >> 1].Edge[0].fCompl + (ulong)((uVar3 & 1) << 4));
      lVar21 = lVar21 + 1;
    } while (k - i != (int)lVar21);
    uVar22 = (ulong)((uVar4 & 1 ^ 1) << 4);
    uVar5 = *(undefined4 *)((long)&pSVar25->Edge[0].Fan + uVar22);
    uVar3 = *(uint *)((long)&pSVar25->Edge[0].fCompl + uVar22);
    *(int *)((long)&pSVar25->Edge[0].Fan + uVar22) = iVar19;
    *(undefined4 *)((long)&pSVar25->Edge[0].fCompl + uVar22) = 0;
    *(int *)((long)&pTree[uVar26 >> 1].Edge[0].Fan + uVar24) = pSVar25->Id;
    *(undefined4 *)((long)&pTree[uVar27].Edge[0].Fan + uVar20) = uVar5;
    puVar1 = (uint *)((long)&pTree[uVar27].Edge[0].fCompl + uVar20);
    *puVar1 = *puVar1 ^ uVar3;
    *(undefined8 *)((long)&pTree[uVar27].Edge[0].FanDel + uVar20) =
         *(undefined8 *)((long)&pSVar25->Edge[0].FanDel + uVar22);
    lVar21 = 1;
    do {
      if (pPath[lVar30 + lVar21] < 0) goto LAB_0072ce35;
      uVar26 = pSVar25->Edge[2].FanDel;
      uVar3 = pTree[(uint)pPath[lVar30 + lVar21] >> 1].Edge[2].FanDel;
      iVar28 = (int)uVar26 >> 4;
      iVar23 = (int)uVar3 >> 4;
      uVar26 = uVar26 & 0xf;
      iVar19 = iVar23;
      if (iVar23 < iVar28) {
        iVar19 = iVar28;
      }
      uVar27 = 1;
      if (iVar28 < iVar23) {
        uVar26 = 1;
      }
      if (iVar28 <= iVar23) {
        uVar27 = uVar3 & 0xf;
      }
      iVar23 = 0x12;
      if ((int)(uVar26 + uVar27) <= pTree->nLutSize) {
        iVar23 = uVar26 + uVar27;
      }
      pSVar25->Edge[2].FanDel = iVar19 * 0x10 + iVar23;
      lVar21 = lVar21 + 1;
    } while (k - i != (int)lVar21);
    if (pNew != (Gia_Man_t *)0x0) {
      uVar26 = 1;
      lVar21 = lVar30;
      do {
        uVar3 = pPath[lVar21];
        if ((int)uVar3 < 0) goto LAB_0072ce35;
        if (pTree[uVar3 >> 1].Edge[2].fCompl != 0) {
          __assert_fail("pTree[Abc_Lit2Var(pPath[c])].Edge[2].fCompl == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                        ,0x636,
                        "void Str_MuxChangeOnce(Str_Mux_t *, int *, int, int, Str_Mux_t *, Gia_Man_t *, Vec_Int_t *)"
                       );
        }
        uVar27 = pTree[uVar3 >> 1].Edge[2].Copy;
        if ((int)uVar27 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10f,"int Abc_LitNotCond(int, int)");
        }
        uVar26 = Gia_ManHashAnd(pNew,uVar26,uVar3 & 1 ^ uVar27 ^ 1);
        if ((int)uVar26 < 0) goto LAB_0072ce35;
        Str_ObjDelay(pNew,uVar26 >> 1,pTree->nLutSize,vDelay);
        lVar21 = lVar21 + 1;
      } while (lVar29 != lVar21);
      if (pPath[lVar30] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10d,"int Abc_LitIsCompl(int)");
      }
      pSVar25->Edge[2].Copy = uVar26 ^ pPath[lVar30] & 1U ^ 1;
      puVar1 = (uint *)((long)&pSVar25->Edge[0].fCompl + (ulong)((uVar4 & 1) << 4));
      *puVar1 = *puVar1 ^ local_5c;
    }
    return;
  }
LAB_0072ce35:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                ,0x10c,"int Abc_Lit2Var(int)");
}

Assistant:

void Str_MuxChangeOnce( Str_Mux_t * pTree, int * pPath, int i, int k, Str_Mux_t * pBackup, Gia_Man_t * pNew, Vec_Int_t * vDelay )
{
    Str_Mux_t * pSpots[3];
    int pInds[3], MidFan, MidCom, MidDel, MidCop, c;
    int iRes, iCond, fCompl;
    // save backup
    assert( i + 1 < k );
    if ( pBackup )
    {
        pBackup[0] = pTree[ Abc_Lit2Var(pPath[k])  ];
        pBackup[1] = pTree[ Abc_Lit2Var(pPath[i+1])];
        pBackup[2] = pTree[ Abc_Lit2Var(pPath[i])  ];
    }
    // perform changes
    pSpots[0] = pTree + Abc_Lit2Var(pPath[k]); 
    pSpots[1] = pTree + Abc_Lit2Var(pPath[i+1]); 
    pSpots[2] = pTree + Abc_Lit2Var(pPath[i]); 
    pInds[0] = Abc_LitIsCompl(pPath[k]);
    pInds[1] = Abc_LitIsCompl(pPath[i+1]);
    pInds[2] = Abc_LitIsCompl(pPath[i]);
    // check
    assert( pSpots[0]->Edge[pInds[0]].Fan > 0 );
    assert( pSpots[1]->Edge[pInds[1]].Fan > 0 );
    // collect complement
    fCompl = 0;
    for ( c = i+1; c < k; c++ )
        fCompl ^= pTree[Abc_Lit2Var(pPath[c])].Edge[Abc_LitIsCompl(pPath[c])].fCompl;
    // remember bottom side
    MidFan = pSpots[2]->Edge[!pInds[2]].Fan;
    MidCom = pSpots[2]->Edge[!pInds[2]].fCompl;
    MidDel = pSpots[2]->Edge[!pInds[2]].FanDel;
    MidCop = pSpots[2]->Edge[!pInds[2]].Copy;
    // update bottom
    pSpots[2]->Edge[!pInds[2]].Fan    = pSpots[0]->Edge[pInds[0]].Fan;
    pSpots[2]->Edge[!pInds[2]].fCompl = 0;
    // update top 
    pSpots[0]->Edge[pInds[0]].Fan     = pSpots[2]->Id;
    // update middle
    pSpots[1]->Edge[pInds[1]].Fan     = MidFan;
    pSpots[1]->Edge[pInds[1]].fCompl ^= MidCom;
    pSpots[1]->Edge[pInds[1]].FanDel  = MidDel;
    pSpots[1]->Edge[pInds[1]].Copy    = MidCop;
    // update delay of the control
    for ( c = i + 1; c < k; c++ )
        pSpots[2]->Edge[2].FanDel = Str_Delay2( pSpots[2]->Edge[2].FanDel, pTree[Abc_Lit2Var(pPath[c])].Edge[2].FanDel, pTree->nLutSize );
    if ( pNew == NULL )
        return;
    // create AND gates
    iRes = 1;
    for ( c = i; c < k; c++ )
    {
        assert( pTree[Abc_Lit2Var(pPath[c])].Edge[2].fCompl == 0 );
        iCond = pTree[Abc_Lit2Var(pPath[c])].Edge[2].Copy;
        iCond = Abc_LitNotCond( iCond, !Abc_LitIsCompl(pPath[c]) );
        iRes  = Gia_ManHashAnd( pNew, iRes, iCond );
        Str_ObjDelay( pNew, Abc_Lit2Var(iRes), pTree->nLutSize, vDelay );
    }
    // complement the condition
    pSpots[2]->Edge[2].Copy = Abc_LitNotCond( iRes, !Abc_LitIsCompl(pPath[i]) );
    // complement the path
    pSpots[2]->Edge[pInds[2]].fCompl ^= fCompl;
}